

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::ExceptionOr<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>::
ExceptionOr(ExceptionOr<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>
            *this,Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer> *value)

{
  Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer> *t;
  Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer> *value_local;
  ExceptionOr<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>
  *this_local;
  
  ExceptionOrValue::ExceptionOrValue(&this->super_ExceptionOrValue);
  t = mv<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>>(value);
  Maybe<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>::Maybe
            (&this->value,t);
  return;
}

Assistant:

ExceptionOr(T&& value): value(kj::mv(value)) {}